

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_test.cpp
# Opt level: O0

XrResult LayerTestXrGetInstanceProcAddr(XrInstance instance,char *name,PFN_xrVoidFunction *function)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  _Self local_38;
  _Self local_30;
  iterator it;
  PFN_xrVoidFunction *function_local;
  char *name_local;
  XrInstance instance_local;
  
  it._M_node = (_Base_ptr)function;
  name_local = (char *)instance;
  iVar2 = strcmp(name,"xrGetInstanceProcAddr");
  if (iVar2 == 0) {
    *(code **)it._M_node = LayerTestXrGetInstanceProcAddr;
  }
  else {
    iVar2 = strcmp(name,"xrCreateInstance");
    if (iVar2 == 0) {
      *(code **)it._M_node = LayerTestXrCreateInstance;
    }
    else {
      iVar2 = strcmp(name,"xrDestroyInstance");
      if (iVar2 == 0) {
        *(code **)it._M_node = LayerTestXrDestroyInstance;
      }
      else {
        *(undefined8 *)it._M_node = 0;
      }
    }
  }
  if (*(long *)it._M_node == 0) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<XrInstance_T_*,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)()),_std::less<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>_>
         ::find(&g_next_gipa_map,(key_type *)&name_local);
    local_38._M_node =
         (_Base_ptr)
         std::
         end<std::map<XrInstance_T*,XrResult(*)(XrInstance_T*,char_const*,void(**)()),std::less<XrInstance_T*>,std::allocator<std::pair<XrInstance_T*const,XrResult(*)(XrInstance_T*,char_const*,void(**)())>>>>
                   (&g_next_gipa_map);
    bVar1 = std::operator==(&local_30,&local_38);
    if (bVar1) {
      instance_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<XrInstance_T_*const,_XrResult_(*)(XrInstance_T_*,_const_char_*,_void_(**)())>_>
               ::operator->(&local_30);
      instance_local._4_4_ =
           (*ppVar3->second)((XrInstance_T *)name_local,name,(_func_void **)it._M_node);
    }
  }
  else {
    instance_local._4_4_ = XR_SUCCESS;
  }
  return instance_local._4_4_;
}

Assistant:

static XRAPI_ATTR XrResult XRAPI_CALL LayerTestXrGetInstanceProcAddr(XrInstance instance, const char *name,
                                                                     PFN_xrVoidFunction *function) {
    if (0 == strcmp(name, "xrGetInstanceProcAddr")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrGetInstanceProcAddr);
    } else if (0 == strcmp(name, "xrCreateInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrCreateInstance);
    } else if (0 == strcmp(name, "xrDestroyInstance")) {
        *function = reinterpret_cast<PFN_xrVoidFunction>(LayerTestXrDestroyInstance);
    } else {
        *function = nullptr;
    }

    if (*function != nullptr) {
        return XR_SUCCESS;
    }

    // If the function is not intercepted in this layer, call down to the next layer.
    auto it = g_next_gipa_map.find(instance);
    if (it == std::end(g_next_gipa_map)) {
        return XR_ERROR_HANDLE_INVALID;
    }

    return it->second(instance, name, function);
}